

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack4_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  uint _w;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  long lVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  ulong uVar25;
  void *pvVar26;
  void *pvVar27;
  undefined4 *puVar28;
  ulong uVar29;
  void *pvVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  void *pvVar34;
  void *pvVar35;
  void *pvVar36;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar29 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x10,inch / 4,outch / 4,4,(Allocator *)0x0);
  lVar6 = (long)local_78.w;
  lVar17 = local_78.elemsize * local_78.cstep;
  sVar1 = kernel_tm->cstep;
  sVar2 = kernel_tm->elemsize;
  lVar32 = local_78.elemsize * lVar6;
  uVar11 = (ulong)_w;
  if ((int)_w < 1) {
    uVar11 = uVar29;
  }
  lVar5 = local_78.cstep * 3;
  lVar4 = lVar6 * 3;
  pvVar3 = kernel_tm->data;
  local_130 = (void *)((lVar4 + lVar5) * local_78.elemsize + (long)local_78.data);
  pvVar35 = (void *)((lVar4 + local_78.cstep * 2) * local_78.elemsize + (long)local_78.data);
  pvVar20 = (void *)((lVar4 + local_78.cstep) * local_78.elemsize + (long)local_78.data);
  local_140 = (void *)(lVar32 * 3 + (long)local_78.data);
  pvVar9 = (void *)((lVar6 * 2 + lVar5) * local_78.elemsize + (long)local_78.data);
  local_138 = (void *)((lVar6 * 2 + local_78.cstep * 2) * local_78.elemsize + (long)local_78.data);
  pvVar26 = (void *)((local_78.cstep + lVar6 * 2) * local_78.elemsize + (long)local_78.data);
  pvVar30 = (void *)((lVar5 + lVar6) * local_78.elemsize + (long)local_78.data);
  pvVar22 = (void *)((lVar6 + local_78.cstep * 2) * local_78.elemsize + (long)local_78.data);
  pvVar15 = (void *)((local_78.cstep + lVar6) * local_78.elemsize + (long)local_78.data);
  lVar6 = lVar32 * 4;
  pvVar14 = (void *)((long)local_78.data + lVar32 * 2);
  pvVar33 = (void *)(lVar32 + (long)local_78.data);
  pvVar24 = (void *)(lVar17 * 3 + (long)local_78.data);
  lVar32 = lVar17 * 4;
  local_148 = (void *)((long)local_78.data + lVar17 * 2);
  pvVar18 = (void *)(lVar17 + (long)local_78.data);
  pvVar8 = local_78.data;
  for (; (long)(uVar29 | 3) < (long)outch; uVar29 = uVar29 + 4) {
    puVar28 = (undefined4 *)((uVar29 >> 2) * sVar1 * sVar2 + (long)pvVar3);
    local_160 = local_148;
    pvVar7 = pvVar15;
    pvVar10 = pvVar9;
    pvVar12 = pvVar20;
    pvVar13 = pvVar14;
    pvVar16 = local_140;
    pvVar19 = local_138;
    pvVar21 = local_130;
    pvVar23 = pvVar22;
    pvVar27 = pvVar26;
    pvVar31 = pvVar30;
    pvVar34 = pvVar33;
    pvVar36 = pvVar35;
    local_158 = pvVar18;
    local_150 = pvVar8;
    local_128 = pvVar24;
    for (uVar25 = 0; (long)(uVar25 | 3) < (long)inch; uVar25 = uVar25 + 4) {
      for (lVar17 = 0; uVar11 << 2 != lVar17; lVar17 = lVar17 + 4) {
        *puVar28 = *(undefined4 *)((long)local_150 + lVar17);
        puVar28[1] = *(undefined4 *)((long)local_158 + lVar17);
        puVar28[2] = *(undefined4 *)((long)local_160 + lVar17);
        puVar28[3] = *(undefined4 *)((long)local_128 + lVar17);
        puVar28[4] = *(undefined4 *)((long)pvVar34 + lVar17);
        puVar28[5] = *(undefined4 *)((long)pvVar7 + lVar17);
        puVar28[6] = *(undefined4 *)((long)pvVar23 + lVar17);
        puVar28[7] = *(undefined4 *)((long)pvVar31 + lVar17);
        puVar28[8] = *(undefined4 *)((long)pvVar13 + lVar17);
        puVar28[9] = *(undefined4 *)((long)pvVar27 + lVar17);
        puVar28[10] = *(undefined4 *)((long)pvVar19 + lVar17);
        puVar28[0xb] = *(undefined4 *)((long)pvVar10 + lVar17);
        puVar28[0xc] = *(undefined4 *)((long)pvVar16 + lVar17);
        puVar28[0xd] = *(undefined4 *)((long)pvVar12 + lVar17);
        puVar28[0xe] = *(undefined4 *)((long)pvVar36 + lVar17);
        puVar28[0xf] = *(undefined4 *)((long)pvVar21 + lVar17);
        puVar28 = puVar28 + 0x10;
      }
      pvVar21 = (void *)((long)pvVar21 + lVar6);
      pvVar36 = (void *)((long)pvVar36 + lVar6);
      pvVar12 = (void *)((long)pvVar12 + lVar6);
      pvVar16 = (void *)((long)pvVar16 + lVar6);
      pvVar10 = (void *)((long)pvVar10 + lVar6);
      pvVar19 = (void *)((long)pvVar19 + lVar6);
      pvVar27 = (void *)((long)pvVar27 + lVar6);
      pvVar13 = (void *)((long)pvVar13 + lVar6);
      pvVar31 = (void *)((long)pvVar31 + lVar6);
      pvVar23 = (void *)((long)pvVar23 + lVar6);
      pvVar7 = (void *)((long)pvVar7 + lVar6);
      pvVar34 = (void *)((long)pvVar34 + lVar6);
      local_128 = (void *)((long)local_128 + lVar6);
      local_160 = (void *)((long)local_160 + lVar6);
      local_158 = (void *)((long)local_158 + lVar6);
      local_150 = (void *)((long)local_150 + lVar6);
    }
    local_130 = (void *)((long)local_130 + lVar32);
    pvVar35 = (void *)((long)pvVar35 + lVar32);
    pvVar20 = (void *)((long)pvVar20 + lVar32);
    local_140 = (void *)((long)local_140 + lVar32);
    pvVar9 = (void *)((long)pvVar9 + lVar32);
    local_138 = (void *)((long)local_138 + lVar32);
    pvVar26 = (void *)((long)pvVar26 + lVar32);
    pvVar14 = (void *)((long)pvVar14 + lVar32);
    pvVar30 = (void *)((long)pvVar30 + lVar32);
    pvVar22 = (void *)((long)pvVar22 + lVar32);
    pvVar15 = (void *)((long)pvVar15 + lVar32);
    pvVar33 = (void *)((long)pvVar33 + lVar32);
    pvVar24 = (void *)((long)pvVar24 + lVar32);
    local_148 = (void *)((long)local_148 + lVar32);
    pvVar18 = (void *)((long)pvVar18 + lVar32);
    pvVar8 = (void *)((long)pvVar8 + lVar32);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack4_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4b-4a-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * maxk, inch / 4, outch / 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00[4] = k01[k];
                g00[5] = k11[k];
                g00[6] = k21[k];
                g00[7] = k31[k];

                g00[8] = k02[k];
                g00[9] = k12[k];
                g00[10] = k22[k];
                g00[11] = k32[k];

                g00[12] = k03[k];
                g00[13] = k13[k];
                g00[14] = k23[k];
                g00[15] = k33[k];

                g00 += 16;
            }
        }
    }
}